

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int ddReorderPostprocess(DdManager *table)

{
  DdManager *table_local;
  
  if (table->interact != (long *)0x0) {
    free(table->interact);
    table->interact = (long *)0x0;
  }
  return 1;
}

Assistant:

static int
ddReorderPostprocess(
  DdManager * table)
{

#ifdef DD_VERBOSE
    (void) fflush(table->out);
#endif

    /* Free interaction matrix. */
    ABC_FREE(table->interact);

    return(1);

}